

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ModportSimplePortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportSimplePortListSyntax,slang::syntax::ModportSimplePortListSyntax_const&>
          (BumpAllocator *this,ModportSimplePortListSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ModportSimplePortListSyntax *pMVar8;
  
  pMVar8 = (ModportSimplePortListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportSimplePortListSyntax *)this->endPtr < pMVar8 + 1) {
    pMVar8 = (ModportSimplePortListSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pMVar8 + 1);
  }
  (pMVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pMVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pMVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pMVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pMVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2768;
  uVar5 = (args->direction).field_0x2;
  NVar6.raw = (args->direction).numFlags.raw;
  uVar7 = (args->direction).rawLen;
  pIVar3 = (args->direction).info;
  (pMVar8->direction).kind = (args->direction).kind;
  (pMVar8->direction).field_0x2 = uVar5;
  (pMVar8->direction).numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar8->direction).rawLen = uVar7;
  (pMVar8->direction).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->ports).super_SyntaxListBase.super_SyntaxNode.parent;
  (pMVar8->ports).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar8->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pMVar8->ports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pMVar8->ports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pMVar8->ports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (pMVar8->ports).super_SyntaxListBase.childCount = (args->ports).super_SyntaxListBase.childCount;
  (pMVar8->ports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5fc0;
  sVar2 = (args->ports).elements._M_extent._M_extent_value;
  (pMVar8->ports).elements._M_ptr = (args->ports).elements._M_ptr;
  (pMVar8->ports).elements._M_extent._M_extent_value = sVar2;
  return pMVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }